

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::XmlReporter(XmlReporter *this,ReporterConfig *config)

{
  (this->super_SharedImpl<Catch::IReporter>).m_rc = 0;
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__XmlReporter_001624f8;
  ReporterConfig::ReporterConfig(&this->m_config,config);
  (this->m_xml).m_tagIsOpen = false;
  (this->m_xml).m_needsNewline = false;
  (this->m_xml).m_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_xml).m_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_xml).m_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_xml).m_indent._M_dataplus._M_p = (pointer)&(this->m_xml).m_indent.field_2;
  (this->m_xml).m_indent._M_string_length = 0;
  (this->m_xml).m_indent.field_2._M_local_buf[0] = '\0';
  (this->m_xml).m_os = (ostream *)&std::cout;
  return;
}

Assistant:

XmlReporter( ReporterConfig const& config ) : m_config( config ) {}